

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_2>_> __thiscall
deqp::gls::BuiltinPrecisionTests::
createApply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,2>,tcu::Matrix<float,2,2>,int,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
          (BuiltinPrecisionTests *this,
          Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Matrix<float,_2,_2>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *func,ExprP<tcu::Matrix<float,_2,_2>_> *arg0,ExprP<int> *arg1,
          ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg2,
          ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg3)

{
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Matrix<float,_2,_2>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_00;
  ExprP<tcu::Vector<float,_2>_> EVar1;
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg3_local;
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg2_local;
  ExprP<int> *arg1_local;
  ExprP<tcu::Matrix<float,_2,_2>_> *arg0_local;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Matrix<float,_2,_2>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *func_local;
  
  this_00 = (Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Matrix<float,_2,_2>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
             *)operator_new(0x50);
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Matrix<float,_2,_2>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Apply(this_00,func,arg0,arg1,arg2,arg3);
  EVar1 = exprP<tcu::Vector<float,2>>(this,(Expr<tcu::Vector<float,_2>_> *)this_00);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}